

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heap.h
# Opt level: O1

void __thiscall
Minisat::Heap<int,_Minisat::Solver::VarOrderLt,_Minisat::MkIndexDefault<int>_>::build
          (Heap<int,_Minisat::Solver::VarOrderLt,_Minisat::MkIndexDefault<int>_> *this,
          vec<int,_int> *ns)

{
  uint uVar1;
  int *piVar2;
  int *piVar3;
  long lVar4;
  int iVar5;
  long lVar6;
  
  if (0 < (this->heap).sz) {
    piVar2 = (this->heap).data;
    piVar3 = (this->indices).map.data;
    lVar4 = 0;
    do {
      iVar5 = piVar2[lVar4];
      if ((this->indices).map.sz <= iVar5) {
        __assert_fail("has(k)",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/mtl/IntMap.h"
                      ,0x28,
                      "V &Minisat::IntMap<int, int>::operator[](K) [K = int, V = int, MkIndex = Minisat::MkIndexDefault<int>]"
                     );
      }
      piVar3[iVar5] = -1;
      lVar4 = lVar4 + 1;
    } while (lVar4 < (this->heap).sz);
  }
  if ((this->heap).data != (int *)0x0) {
    (this->heap).sz = 0;
  }
  if (0 < ns->sz) {
    lVar6 = 0;
    lVar4 = 0;
    do {
      piVar2 = ns->data;
      iVar5 = *(int *)((long)piVar2 + lVar6);
      if ((this->indices).map.sz <= iVar5) {
        __assert_fail("indices.has(ns[i])",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/mtl/Heap.h"
                      ,0x93,
                      "void Minisat::Heap<int, Minisat::Solver::VarOrderLt>::build(const vec<K> &) [K = int, Comp = Minisat::Solver::VarOrderLt, MkIndex = Minisat::MkIndexDefault<int>]"
                     );
      }
      (this->indices).map.data[iVar5] = (int)lVar4;
      vec<int,_int>::push(&this->heap,(int *)((long)piVar2 + lVar6));
      lVar4 = lVar4 + 1;
      lVar6 = lVar6 + 4;
    } while (lVar4 < ns->sz);
  }
  uVar1 = (this->heap).sz;
  if (1 < (int)uVar1) {
    iVar5 = (uVar1 >> 1) + 1;
    do {
      percolateDown(this,iVar5 + -2);
      iVar5 = iVar5 + -1;
    } while (1 < iVar5);
  }
  return;
}

Assistant:

void build(const vec<K>& ns) {
        for (int i = 0; i < heap.size(); i++)
            indices[heap[i]] = -1;
        heap.clear();

        for (int i = 0; i < ns.size(); i++){
            // TODO: this should probably call reserve instead of relying on it being reserved already.
            assert(indices.has(ns[i]));
            indices[ns[i]] = i;
            heap.push(ns[i]); }

        for (int i = heap.size() / 2 - 1; i >= 0; i--)
            percolateDown(i);
    }